

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall CLPIParser::parseSequenceInfo(CLPIParser *this,uint8_t *buffer,uint8_t *end)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  uint uVar6;
  BitStreamReader reader;
  BitStreamReader local_50;
  
  local_50.super_BitStream.m_totalBits = 0;
  local_50.super_BitStream.m_buffer = (uint *)0x0;
  local_50.super_BitStream.m_initBuffer = (uint *)0x0;
  local_50.m_curVal = 0;
  local_50.m_bitLeft = 0;
  BitStream::setBuffer(&local_50.super_BitStream,buffer,end);
  local_50._24_8_ = local_50._24_8_ & 0xffffffff;
  local_50.m_curVal = BitStreamReader::getCurVal(&local_50,local_50.super_BitStream.m_buffer);
  local_50.m_bitLeft = 0x20;
  BitStreamReader::skipBits(&local_50,0x20);
  BitStreamReader::skipBits(&local_50,8);
  uVar1 = BitStreamReader::getBits(&local_50,8);
  if ((char)uVar1 != '\0') {
    cVar5 = '\0';
    do {
      BitStreamReader::skipBits(&local_50,0x20);
      uVar2 = BitStreamReader::getBits(&local_50,8);
      uVar3 = BitStreamReader::getBits(&local_50,8);
      if ((uVar2 & 0xff) != 0) {
        uVar6 = uVar3 & 0xff;
        do {
          BitStreamReader::skipBits(&local_50,0x10);
          BitStreamReader::skipBits(&local_50,0x20);
          uVar4 = BitStreamReader::getBits(&local_50,0x20);
          this->presentation_start_time = uVar4;
          uVar4 = BitStreamReader::getBits(&local_50,0x20);
          this->presentation_end_time = uVar4;
          uVar3 = uVar3 + 1 & 0xff;
        } while (uVar3 < uVar6 + (uVar2 & 0xff));
      }
      cVar5 = cVar5 + '\x01';
    } while (cVar5 != (char)uVar1);
  }
  return;
}

Assistant:

void CLPIParser::parseSequenceInfo(uint8_t* buffer, const uint8_t* end)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, end);
    reader.skipBits(32);                                              // length
    reader.skipBits(8);                                               // reserved_for_word_align
    const auto number_of_ATC_sequences = reader.getBits<uint8_t>(8);  // 1 is tipical value
    for (uint8_t atc_id = 0; atc_id < number_of_ATC_sequences; atc_id++)
    {
        reader.skipBits(32);  // SPN_ATC_start, 0 is tipical value
        const auto number_of_STC_sequences = reader.getBits<uint8_t>(8);
        const auto offset_STC_id = reader.getBits<uint8_t>(8);
        for (uint8_t stc_id = offset_STC_id; stc_id < number_of_STC_sequences + offset_STC_id; stc_id++)
        {
            reader.skipBits(16);  // PCR_PID
            reader.skipBits(32);  // SPN_STC_start
            presentation_start_time = reader.getBits(32);
            presentation_end_time = reader.getBits(32);
        }
    }
}